

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::leaveEvent(QMdiSubWindow *this,QEvent *param_2)

{
  int iVar1;
  int iVar2;
  QMdiSubWindowPrivate *rgn;
  QWidget *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindowPrivate *d;
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  rgn = d_func((QMdiSubWindow *)0x63566f);
  if (rgn->hoveredSubControl != SC_None) {
    rgn->hoveredSubControl = SC_None;
    iVar1 = QWidget::width((QWidget *)0x63569b);
    iVar2 = QMdiSubWindowPrivate::titleBarHeight(in_RDI);
    QRegion::QRegion(&local_10,0,0,iVar1,iVar2,Rectangle);
    QWidget::update(in_RSI,(QRegion *)rgn);
    QRegion::~QRegion(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::leaveEvent(QEvent * /*leaveEvent*/)
{
    Q_D(QMdiSubWindow);
    if (d->hoveredSubControl != QStyle::SC_None) {
        d->hoveredSubControl = QStyle::SC_None;
        update(QRegion(0, 0, width(), d->titleBarHeight()));
    }
}